

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

IndexType GetIndexTypeFromPrimitive
                    (Var indexVar,ScriptContext *scriptContext,uint32 *index,
                    PropertyRecord **propertyRecord,JavascriptString **propertyNameString,
                    bool createIfNotFound,bool preferJavascriptStringOverPropertyRecord)

{
  code *pcVar1;
  uint32 *puVar2;
  bool bVar3;
  int iVar4;
  charcount_t propertyLength;
  IndexType IVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  JavascriptSymbol *pJVar8;
  JavascriptString *this;
  char16 *str;
  uint32 value;
  uint32 local_78 [2];
  char16 stringBuffer [22];
  bool local_31 [8];
  bool isInt32;
  
  unique0x1000027d = index;
  if (((ulong)indexVar & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)indexVar & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)indexVar & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)indexVar >> 0x32 != 0) {
        local_78[0] = 0;
        local_31[0] = false;
        bVar3 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                          ((double)((ulong)indexVar ^ 0xfffc000000000000),(int32 *)local_78,local_31
                          );
        if ((bVar3) && ((local_78[0] == 0xffffffff | local_31[0]) != 1)) {
          *stack0xffffffffffffffb8 = local_78[0];
          return IndexType_Number;
        }
      }
      bVar3 = Js::VarIs<Js::JavascriptSymbol>(indexVar);
      if ((bVar3) &&
         (pJVar8 = Js::UnsafeVarTo<Js::JavascriptSymbol>(indexVar),
         pJVar8 != (JavascriptSymbol *)0x0)) {
        *propertyRecord = (pJVar8->propertyRecordUsageCache).propertyRecord.ptr;
        return IndexType_PropertyId;
      }
      this = Js::JavascriptConversion::ToString(indexVar,scriptContext);
      str = Js::JavascriptString::GetString(this);
      propertyLength = Js::JavascriptString::GetLength(this);
      puVar2 = stack0xffffffffffffffb8;
      if (!preferJavascriptStringOverPropertyRecord || createIfNotFound) {
        IVar5 = GetIndexTypeFromString
                          (str,propertyLength,scriptContext,stack0xffffffffffffffb8,propertyRecord,
                           createIfNotFound);
        return IVar5;
      }
      BVar6 = Js::NumberUtilities::TryConvertToUInt32(str,propertyLength,stack0xffffffffffffffb8);
      if ((BVar6 != 0) && (*puVar2 != 0xffffffff)) {
        return IndexType_Number;
      }
      *propertyNameString = this;
      return IndexType_JavascriptString;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00aa420e;
    *puVar7 = 0;
  }
  if (((ulong)indexVar & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00aa420e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  value = (uint32)indexVar;
  if ((int)value < 0) {
    iVar4 = Js::TaggedInt::ToBuffer(value,(char16 *)local_78,0x16);
    if (createIfNotFound || preferJavascriptStringOverPropertyRecord) {
      Js::ScriptContext::GetOrAddPropertyRecord
                (scriptContext,stringBuffer + (long)iVar4 + -4,0x15 - iVar4,propertyRecord);
    }
    else {
      Js::ScriptContext::FindPropertyRecord
                (scriptContext,stringBuffer + (long)iVar4 + -4,0x15 - iVar4,propertyRecord);
    }
    return IndexType_PropertyId;
  }
  *stack0xffffffffffffffb8 = value;
  return IndexType_Number;
}

Assistant:

IndexType GetIndexTypeFromPrimitive(Var indexVar, ScriptContext* scriptContext, uint32* index, PropertyRecord const ** propertyRecord, JavascriptString ** propertyNameString, bool createIfNotFound, bool preferJavascriptStringOverPropertyRecord)
    {
        // CONSIDER: Only OP_SetElementI and OP_GetElementI use and take advantage of the
        // IndexType_JavascriptString result. Consider modifying other callers of GetIndexType to take
        // advantage of non-interned property strings where appropriate.
        if (TaggedInt::Is(indexVar))
        {
            int indexInt = TaggedInt::ToInt32(indexVar);
            if (indexInt >= 0)
            {
                *index = (uint)indexInt;
                return IndexType_Number;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(indexInt, stringBuffer, _countof(stringBuffer));
                charcount_t length = (_countof(stringBuffer) - 1) - pos;
                if (createIfNotFound || preferJavascriptStringOverPropertyRecord)
                {
                    // When preferring JavascriptString objects, just return a PropertyRecord instead
                    // of creating temporary JavascriptString objects for every negative integer that
                    // comes through here.
                    scriptContext->GetOrAddPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                else
                {
                    scriptContext->FindPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                return IndexType_PropertyId;
            }
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(indexVar))
        {
            // If this double can be a positive integer index, convert it.
            int32 value = 0;
            bool isInt32 = false;
            if (JavascriptNumber::TryGetInt32OrUInt32Value(JavascriptNumber::GetValue(indexVar), &value, &isInt32)
                && !isInt32
                && static_cast<uint32>(value) < JavascriptArray::InvalidIndex)
            {
                *index = static_cast<uint32>(value);
                return IndexType_Number;
            }

            // Fall through to slow string conversion.
        }

        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(indexVar);
        if (symbol)
        {
            // JavascriptSymbols cannot add a new PropertyRecord - they correspond to one and only one existing PropertyRecord.
            // We already know what the PropertyRecord is since it is stored in the JavascriptSymbol itself so just return it.

            *propertyRecord = symbol->GetValue();
            return IndexType_PropertyId;
        }
        else
        {
            JavascriptString* indexStr = JavascriptConversion::ToString(indexVar, scriptContext);

            char16 const * propertyName = indexStr->GetString();
            charcount_t const propertyLength = indexStr->GetLength();

            if (!createIfNotFound && preferJavascriptStringOverPropertyRecord)
            {
                if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
                    (*index != JavascriptArray::InvalidIndex))
                {
                    return IndexType_Number;
                }

                *propertyNameString = indexStr;
                return IndexType_JavascriptString;
            }
            return GetIndexTypeFromString(propertyName, propertyLength, scriptContext, index, propertyRecord, createIfNotFound);
        }
    }